

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O1

int archive_write_set_skip_file(archive *_a,int64_t d,int64_t i)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,0x7fff,"archive_write_set_skip_file");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    _a[1].magic = 1;
    _a[1].vtable = (archive_vtable_conflict *)d;
    *(int64_t *)&_a[1].archive_format = i;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
archive_write_set_skip_file(struct archive *_a, int64_t d, int64_t i)
{
	struct archive_write *a = (struct archive_write *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_set_skip_file");
	a->skip_file_set = 1;
	a->skip_file_dev = d;
	a->skip_file_ino = i;
	return (ARCHIVE_OK);
}